

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_not(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  int opsize;
  TCGv_i32 pTVar1;
  TCGv_i32 ret;
  undefined6 in_register_00000012;
  TCGv_i32 addr;
  
  tcg_ctx = s->uc->tcg_ctx;
  opsize = insn_opsize((int)CONCAT62(in_register_00000012,insn));
  pTVar1 = gen_ea(env,s,insn,opsize,tcg_ctx->NULL_QREG,&addr,EA_LOADS,
                  (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if (pTVar1 != tcg_ctx->NULL_QREG) {
    ret = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_not_i32(tcg_ctx,ret,pTVar1);
    pTVar1 = gen_ea(env,s,insn,opsize,ret,&addr,EA_STORE,
                    (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
    if (pTVar1 != tcg_ctx->NULL_QREG) {
      gen_logic_cc(s,ret,opsize);
      return;
    }
  }
  gen_addr_fault(s);
  return;
}

Assistant:

DISAS_INSN(not)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src1;
    TCGv dest;
    TCGv addr;
    int opsize;

    opsize = insn_opsize(insn);
    SRC_EA(env, src1, opsize, 1, &addr);
    dest = tcg_temp_new(tcg_ctx);
    tcg_gen_not_i32(tcg_ctx, dest, src1);
    DEST_EA(env, insn, opsize, dest, &addr);
    gen_logic_cc(s, dest, opsize);
}